

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O1

bool __thiscall llama_context::rm_adapter_lora(llama_context *this,llama_adapter_lora *adapter)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  _Node_iterator_base<std::pair<llama_adapter_lora_*const,_float>,_false> __it;
  __node_base_ptr p_Var5;
  
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: adapter = %p\n","rm_adapter_lora",adapter);
  uVar1 = (this->loras)._M_h._M_bucket_count;
  uVar3 = (ulong)adapter % uVar1;
  p_Var4 = (this->loras)._M_h._M_buckets[uVar3];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var4->_M_nxt, p_Var5 = p_Var4,
     (llama_adapter_lora *)p_Var4->_M_nxt[1]._M_nxt != adapter)) {
    while (p_Var4 = p_Var2, p_Var2 = p_Var4->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar3) ||
         (p_Var5 = p_Var4, (llama_adapter_lora *)p_Var2[1]._M_nxt == adapter)) goto LAB_0018ec44;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_0018ec44:
  if (p_Var5 == (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)0x0;
  }
  else {
    __it._M_cur = (__node_type *)p_Var5->_M_nxt;
  }
  if (__it._M_cur != (__node_type *)0x0) {
    std::
    _Hashtable<llama_adapter_lora_*,_std::pair<llama_adapter_lora_*const,_float>,_std::allocator<std::pair<llama_adapter_lora_*const,_float>_>,_std::__detail::_Select1st,_std::equal_to<llama_adapter_lora_*>,_std::hash<llama_adapter_lora_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->loras)._M_h,(const_iterator)__it._M_cur);
  }
  return __it._M_cur != (__node_type *)0x0;
}

Assistant:

bool llama_context::rm_adapter_lora(
            llama_adapter_lora * adapter) {
    LLAMA_LOG_DEBUG("%s: adapter = %p\n", __func__, (void *) adapter);

    auto pos = loras.find(adapter);
    if (pos != loras.end()) {
        loras.erase(pos);
        return true;
    }

    return false;
}